

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O1

void largest_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  ulong uVar2;
  
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *vals;
  }
  *accum = iVar1;
  if (1 < n) {
    uVar2 = 1;
    do {
      iVar1 = vals[uVar2];
      if (iVar1 != 0x7ffffffe) {
        if (iVar1 == 0x7fffffff) {
          iVar1 = 0x7fffffff;
          if (*accum == 0x7ffffffe) {
LAB_001dee1e:
            *accum = iVar1;
          }
        }
        else if ((0x7ffffffd < *accum) || (*accum < iVar1)) goto LAB_001dee1e;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *auxs;
  }
  *accum_aux = iVar1;
  if (1 < n) {
    uVar2 = 1;
    do {
      iVar1 = auxs[uVar2];
      if (iVar1 != 0x7ffffffe) {
        if (iVar1 == 0x7fffffff) {
          iVar1 = 0x7fffffff;
          if (*accum_aux == 0x7ffffffe) {
LAB_001dee75:
            *accum_aux = iVar1;
          }
        }
        else if ((0x7ffffffd < *accum_aux) || (*accum_aux < iVar1)) goto LAB_001dee75;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

static void largest_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		largest_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		largest_combine_accum_help(auxs[i], accum_aux);
	}
}